

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase181::run(TestCase181 *this)

{
  PointerBuilder *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  Builder builder_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  DebugComparison<int,_unsigned_int> _kjCondition_3;
  uint local_2f8;
  ushort uStack_2f4;
  ElementSize EStack_2f2;
  undefined1 uStack_2f1;
  uint local_2dc;
  DebugComparison<int,_unsigned_long> _kjCondition_4;
  DebugComparison<int,_unsigned_int> local_278;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  StructDataBitCount local_238;
  undefined4 uStack_234;
  int iStack_230;
  undefined4 uStack_22c;
  undefined1 local_228 [32];
  CapTableBuilder *pCStack_208;
  WirePointer *local_200;
  ReaderFor<capnp::AnyList> readPtr;
  Builder root;
  BuilderFor<capnp::AnyList> ptr;
  StructBuilder local_170;
  Builder b;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&_kjCondition_3,&builder.super_MessageBuilder);
  readPtr._reader.ptr = (byte *)_kjCondition_3.op.content.size_;
  readPtr._reader.segment = (SegmentReader *)_kjCondition_3._0_8_;
  readPtr._reader.capTable = (CapTableReader *)_kjCondition_3.op.content.ptr;
  PointerBuilder::getStruct
            (&root._builder,(PointerBuilder *)&readPtr,(StructSize)0x10000,(word *)0x0);
  readPtr._reader.segment = &(root._builder.segment)->super_SegmentReader;
  readPtr._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  readPtr._reader.ptr = (byte *)root._builder.pointers;
  PointerBuilder::initStructList(&b.builder,(PointerBuilder *)&readPtr,2,(StructSize)0x140006);
  ListBuilder::getStructElement(&local_170,&b.builder,0);
  builder_00._builder.capTable = (CapTableBuilder *)_kjCondition_2.op.content.size_;
  builder_00._builder.segment = (SegmentBuilder *)_kjCondition_2.op.content.ptr;
  builder_00._builder.data._0_1_ = _kjCondition_2.result;
  builder_00._builder.data._1_3_ = _kjCondition_2._25_3_;
  builder_00._builder.data._4_4_ = _kjCondition_2._28_4_;
  builder_00._builder.pointers._0_4_ = local_238;
  builder_00._builder.pointers._4_4_ = uStack_234;
  builder_00._builder.dataSize = iStack_230;
  builder_00._builder._36_4_ = uStack_22c;
  initTestMessage(builder_00);
  readPtr._reader.segment = &(root._builder.segment)->super_SegmentReader;
  readPtr._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  readPtr._reader.ptr = (byte *)root._builder.pointers;
  PointerBuilder::getListAnySize(&ptr._builder,(PointerBuilder *)&readPtr,(word *)0x0);
  readPtr._reader.segment = (SegmentReader *)CONCAT44(ptr._builder.elementCount,2);
  readPtr._reader.capTable = (CapTableReader *)anon_var_dwarf_a9f8;
  readPtr._reader.ptr = &DAT_00000005;
  readPtr._reader.elementCount._0_1_ = ptr._builder.elementCount == 2;
  if ((ptr._builder.elementCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 2;
    _kjCondition_2.left = ptr._builder.elementCount;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xbd,ERROR,
               "\"failed: expected \" \"(2) == (ptr.size())\", _kjCondition, 2, ptr.size()",
               (char (*) [37])"failed: expected (2) == (ptr.size())",
               (DebugComparison<int,_unsigned_int> *)&readPtr,&_kjCondition_3.left,
               (uint *)&_kjCondition_2);
  }
  _kjCondition_2.op.content.size_ = (size_t)ptr._builder.ptr;
  _kjCondition_2._24_4_ = ptr._builder.elementCount;
  _kjCondition_2._0_8_ = ptr._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)ptr._builder.capTable;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0);
  uVar6 = local_2f8 >> 3;
  readPtr._reader.capTable = (CapTableReader *)(ulong)uVar6;
  readPtr._reader.segment = (SegmentReader *)CONCAT44(readPtr._reader.segment._4_4_,0x30);
  readPtr._reader.ptr = " == ";
  readPtr._reader.elementCount = 5;
  readPtr._reader.step = 0;
  readPtr._reader.structDataSize = CONCAT31(readPtr._reader.structDataSize._1_3_,uVar6 == 0x30);
  if ((uVar6 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_228._24_4_ = 0x30;
    _kjCondition_2.op.content.size_ = (size_t)ptr._builder.ptr;
    _kjCondition_2._24_4_ = ptr._builder.elementCount;
    _kjCondition_2._0_8_ = ptr._builder.segment;
    _kjCondition_2.op.content.ptr = (char *)ptr._builder.capTable;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0)
    ;
    _kjCondition_4._0_8_ = ZEXT48(local_2f8 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xbe,ERROR,
               "\"failed: expected \" \"(48) == (ptr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, ptr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (ptr.as<List<AnyStruct>>()[0].getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&readPtr,(int *)(local_228 + 0x18),
               (unsigned_long *)&_kjCondition_4);
  }
  local_2f8 = ptr._builder.structDataSize;
  uStack_2f4 = ptr._builder.structPointerCount;
  _EStack_2f2 = ptr._builder._38_2_;
  _kjCondition_3.op.content.size_ = (size_t)ptr._builder.ptr;
  _kjCondition_3._0_8_ = ptr._builder.segment;
  _kjCondition_3.op.content.ptr = (char *)ptr._builder.capTable;
  ListBuilder::getStructElement((StructBuilder *)&readPtr,(ListBuilder *)&_kjCondition_3,0);
  _kjCondition_2.right._0_2_ = readPtr._reader.structPointerCount;
  _kjCondition_2.left = 0x14;
  _kjCondition_2.right._2_2_ = 0;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = readPtr._reader.structPointerCount == 0x14;
  if ((readPtr._reader.structPointerCount != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_4.left = 0x14;
    local_2f8 = ptr._builder.structDataSize;
    uStack_2f4 = ptr._builder.structPointerCount;
    _EStack_2f2 = ptr._builder._38_2_;
    _kjCondition_3.op.content.size_ = (size_t)ptr._builder.ptr;
    _kjCondition_3._0_8_ = ptr._builder.segment;
    _kjCondition_3.op.content.ptr = (char *)ptr._builder.capTable;
    ListBuilder::getStructElement((StructBuilder *)&readPtr,(ListBuilder *)&_kjCondition_3,0);
    uVar5 = local_228._24_8_;
    local_228._26_2_ = 0;
    local_228._24_2_ = readPtr._reader.structPointerCount;
    local_228._28_4_ = SUB84(uVar5,4);
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xbf,ERROR,
               "\"failed: expected \" \"(20) == (ptr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, ptr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (ptr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,&_kjCondition_2,&_kjCondition_4.left,(uint *)(local_228 + 0x18));
  }
  uVar6 = local_2f8;
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.right = (unsigned_long)root._builder.capTable;
  _kjCondition_4.op.content.ptr = (char *)root._builder.pointers;
  PointerBuilder::asReader((PointerBuilder *)&_kjCondition_4);
  _kjCondition_3.op.content.size_ = _kjCondition_2.op.content.size_;
  _kjCondition_3.result = _kjCondition_2.result;
  _kjCondition_3._25_3_ = _kjCondition_2._25_3_;
  _kjCondition_3.left = _kjCondition_2.left;
  _kjCondition_3.right = _kjCondition_2.right;
  _kjCondition_3.op.content.ptr = _kjCondition_2.op.content.ptr;
  PointerReader::getListAnySize(&readPtr._reader,(PointerReader *)&_kjCondition_3,(word *)0x0);
  _kjCondition_3.right = readPtr._reader.elementCount;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  _kjCondition_3.result = readPtr._reader.elementCount == 2;
  if ((readPtr._reader.elementCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = readPtr._reader.elementCount;
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc3,ERROR,
               "\"failed: expected \" \"(2) == (readPtr.size())\", _kjCondition, 2, readPtr.size()",
               (char (*) [41])"failed: expected (2) == (readPtr.size())",&_kjCondition_3,
               &_kjCondition_2.left,(uint *)&_kjCondition_4);
  }
  _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
  _kjCondition_2._24_4_ = readPtr._reader.elementCount;
  _kjCondition_2._28_4_ = readPtr._reader.step;
  _kjCondition_2._0_8_ = readPtr._reader.segment;
  _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar7 = local_2f8 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar7;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar7 == 0x30;
  if ((uVar7 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_228._0_4_ = 0x30;
    _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
    _kjCondition_2._24_4_ = readPtr._reader.elementCount;
    _kjCondition_2._28_4_ = readPtr._reader.step;
    _kjCondition_2._0_8_ = readPtr._reader.segment;
    _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_228._24_8_ = ZEXT48(local_2f8 >> 3);
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc4,ERROR,
               "\"failed: expected \" \"(48) == (readPtr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, readPtr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [84])
                "failed: expected (48) == (readPtr.as<List<AnyStruct>>()[0].getDataSection().size())"
               ,&_kjCondition_4,(int *)local_228,(unsigned_long *)(local_228 + 0x18));
  }
  local_238 = readPtr._reader.structDataSize;
  _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
  _kjCondition_2._24_4_ = readPtr._reader.elementCount;
  _kjCondition_2._28_4_ = readPtr._reader.step;
  _kjCondition_2._0_8_ = readPtr._reader.segment;
  _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  _kjCondition_4._4_2_ = uStack_2f4;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_a9f8;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_2f4 == 0x14;
  if ((uStack_2f4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_228._24_4_ = 0x14;
    local_238 = readPtr._reader.structDataSize;
    _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
    _kjCondition_2._24_4_ = readPtr._reader.elementCount;
    _kjCondition_2._28_4_ = readPtr._reader.step;
    _kjCondition_2._0_8_ = readPtr._reader.segment;
    _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    uVar5 = local_228._0_8_;
    local_228._2_2_ = 0;
    local_228._0_2_ = uStack_2f4;
    local_228._4_4_ = SUB84(uVar5,4);
    kj::_::Debug::log<char_const(&)[87],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc5,ERROR,
               "\"failed: expected \" \"(20) == (readPtr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, readPtr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [87])
                "failed: expected (20) == (readPtr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)(local_228 + 0x18),
               (uint *)local_228);
  }
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_2,(StructSize)0x140006,
             (word *)0x0);
  uVar2 = _kjCondition_3._24_4_;
  local_228._0_4_ = _kjCondition_3.left;
  local_228._4_4_ = _kjCondition_3.right;
  local_228._8_8_ = _kjCondition_3.op.content.ptr;
  local_228._16_8_ = _kjCondition_3.op.content.size_;
  uVar1._2_1_ = EStack_2f2;
  uVar1._3_1_ = uStack_2f1;
  uVar1._0_2_ = uStack_2f4;
  _kjCondition_3.left = 2;
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar9 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar9;
  if ((!bVar9) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar2;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"(2) == (alb.size())\", _kjCondition, 2, alb.size()",
               (char (*) [37])"failed: expected (2) == (alb.size())",&_kjCondition_3,
               &_kjCondition_2.left,(uint *)&_kjCondition_4);
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_4.op.content.ptr = (char *)local_228._16_8_;
  _kjCondition_4._0_8_ = local_228._0_8_;
  _kjCondition_4.right = local_228._8_8_;
  _kjCondition_3.result = SUB41(uVar2,0);
  _kjCondition_3._25_3_ = SUB43(uVar2,1);
  _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
  _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
  _kjCondition_4._32_4_ = local_2f8;
  _kjCondition_3._24_4_ = uVar3;
  _kjCondition_4._36_4_ = uVar1;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0);
  uVar8 = local_238 >> 3;
  _kjCondition_3.op.content.ptr = (char *)(ulong)uVar8;
  _kjCondition_3.left = 0x30;
  _kjCondition_3.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition_3.result = true;
  _kjCondition_3._25_3_ = 0;
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_3._28_4_ = 0;
  local_2f8 = CONCAT31(local_2f8._1_3_,uVar8 == 0x30);
  uVar7 = local_2f8;
  if ((uVar8 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_278.left = 0x30;
    _kjCondition_4.op.content.ptr = (char *)local_228._16_8_;
    _kjCondition_4._0_8_ = local_228._0_8_;
    _kjCondition_4.right = local_228._8_8_;
    _kjCondition_3.result = SUB41(uVar2,0);
    _kjCondition_3._25_3_ = SUB43(uVar2,1);
    _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
    _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
    _kjCondition_4._32_4_ = uVar6;
    _kjCondition_3._24_4_ = uVar3;
    _kjCondition_4._36_4_ = uVar1;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0)
    ;
    local_228._24_8_ = ZEXT48(local_238 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"(48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alb.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition_3,&local_278.left,
               (unsigned_long *)(local_228 + 0x18));
  }
  uVar1 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_228._16_8_;
  _kjCondition_2.left = local_228._0_4_;
  _kjCondition_2.right = local_228._4_4_;
  _kjCondition_2.op.content.ptr = (char *)local_228._8_8_;
  _kjCondition_3.result = SUB41(uVar2,0);
  _kjCondition_3._25_3_ = SUB43(uVar2,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_3._24_4_ = uVar1;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0);
  uVar1 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_a9f8;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_2f4 == 0x14;
  if ((uStack_2f4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_228._24_4_ = 0x14;
    _kjCondition_2.op.content.size_ = local_228._16_8_;
    _kjCondition_2.left = local_228._0_4_;
    _kjCondition_2.right = local_228._4_4_;
    _kjCondition_2.op.content.ptr = (char *)local_228._8_8_;
    _kjCondition_3.result = SUB41(uVar2,0);
    _kjCondition_3._25_3_ = SUB43(uVar2,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_3._24_4_ = uVar1;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0)
    ;
    local_278.left = (uint)uStack_2f4;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xca,ERROR,
               "\"failed: expected \" \"(20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alb.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)(local_228 + 0x18),
               (uint *)&local_278);
  }
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&_kjCondition_3,(PointerBuilder *)&_kjCondition_2,(StructSize)0x140006,
             (word *)0x0);
  uVar3 = _kjCondition_3._28_4_;
  uVar1 = _kjCondition_3._24_4_;
  local_228._0_4_ = _kjCondition_3.left;
  local_228._4_4_ = _kjCondition_3.right;
  local_228._8_8_ = _kjCondition_3.op.content.ptr;
  local_228._16_8_ = _kjCondition_3.op.content.size_;
  uVar2._2_1_ = EStack_2f2;
  uVar2._3_1_ = uStack_2f1;
  uVar2._0_2_ = uStack_2f4;
  _kjCondition_3.left = 2;
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar9 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar9;
  if ((!bVar9) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"(2) == (alb.size())\", _kjCondition, 2, alb.size()",
               (char (*) [37])"failed: expected (2) == (alb.size())",&_kjCondition_3,
               &_kjCondition_2.left,(uint *)&_kjCondition_4);
  }
  uVar4 = _kjCondition_3._24_4_;
  _kjCondition_4.op.content.ptr = (char *)local_228._16_8_;
  _kjCondition_4._0_8_ = local_228._0_8_;
  _kjCondition_4.right = local_228._8_8_;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
  _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
  _kjCondition_4.op.content.size_._4_4_ = uVar3;
  _kjCondition_4._32_4_ = local_2f8;
  _kjCondition_3._24_4_ = uVar4;
  _kjCondition_4._36_4_ = uVar2;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0);
  uVar8 = uVar6 >> 3;
  _kjCondition_3.op.content.ptr = (char *)(ulong)uVar8;
  _kjCondition_3.left = 0x30;
  _kjCondition_3.op.content.size_ = (size_t)anon_var_dwarf_a9f8;
  _kjCondition_3.result = true;
  _kjCondition_3._25_3_ = 0;
  uVar4 = _kjCondition_3._24_4_;
  _kjCondition_3._28_4_ = 0;
  local_2f8 = CONCAT31(local_2f8._1_3_,uVar8 == 0x30);
  if ((uVar8 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_278.left = 0x30;
    _kjCondition_4.op.content.ptr = (char *)local_228._16_8_;
    _kjCondition_4._0_8_ = local_228._0_8_;
    _kjCondition_4.right = local_228._8_8_;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
    _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
    _kjCondition_4.op.content.size_._4_4_ = uVar3;
    _kjCondition_4._32_4_ = uVar7;
    _kjCondition_3._24_4_ = uVar4;
    _kjCondition_4._36_4_ = uVar2;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0)
    ;
    local_228._24_8_ = ZEXT48(uVar6 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xcf,ERROR,
               "\"failed: expected \" \"(48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alb.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition_3,&local_278.left,
               (unsigned_long *)(local_228 + 0x18));
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_228._16_8_;
  _kjCondition_2.left = local_228._0_4_;
  _kjCondition_2.right = local_228._4_4_;
  _kjCondition_2.op.content.ptr = (char *)local_228._8_8_;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar3;
  _kjCondition_3._24_4_ = uVar2;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_a9f8;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_2f4 == 0x14;
  if ((uStack_2f4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_228._24_4_ = 0x14;
    _kjCondition_2.op.content.size_ = local_228._16_8_;
    _kjCondition_2.left = local_228._0_4_;
    _kjCondition_2.right = local_228._4_4_;
    _kjCondition_2.op.content.ptr = (char *)local_228._8_8_;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar3;
    _kjCondition_3._24_4_ = uVar2;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0)
    ;
    local_278.left = (uint)uStack_2f4;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd0,ERROR,
               "\"failed: expected \" \"(20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alb.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)(local_228 + 0x18),
               (uint *)&local_278);
  }
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.right = (unsigned_long)root._builder.capTable;
  _kjCondition_4.op.content.ptr = (char *)root._builder.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&_kjCondition_2,(PointerBuilder *)&_kjCondition_4,(StructSize)0x140006,
             (word *)0x0);
  ListBuilder::asReader((ListReader *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2);
  uVar2 = _kjCondition_3._28_4_;
  uVar1 = _kjCondition_3._24_4_;
  local_278.op.content.size_ = _kjCondition_3.op.content.size_;
  local_278.left = _kjCondition_3.left;
  local_278.right = _kjCondition_3.right;
  local_278.op.content.ptr = _kjCondition_3.op.content.ptr;
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar9 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar9;
  if ((!bVar9) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd4,ERROR,
               "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
               (char (*) [37])"failed: expected (2) == (alr.size())",&_kjCondition_3,
               (int *)&_kjCondition_2,(uint *)&_kjCondition_4);
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_278.op.content.size_;
  _kjCondition_2.left = local_278.left;
  _kjCondition_2.right = local_278.right;
  _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar2;
  _kjCondition_3._24_4_ = uVar3;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar3 = _kjCondition_3._24_4_;
  uVar6 = local_2f8 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar6;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar6 == 0x30;
  if ((uVar6 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2dc = 0x30;
    _kjCondition_2.op.content.size_ = local_278.op.content.size_;
    _kjCondition_2.left = local_278.left;
    _kjCondition_2.right = local_278.right;
    _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar2;
    _kjCondition_3._24_4_ = uVar3;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_228._24_8_ = ZEXT48(local_2f8 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd5,ERROR,
               "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
               &_kjCondition_4,(int *)&local_2dc,(unsigned_long *)(local_228 + 0x18));
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_278.op.content.size_;
  _kjCondition_2.left = local_278.left;
  _kjCondition_2.right = local_278.right;
  _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar2;
  _kjCondition_3._24_4_ = uVar3;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_a9f8;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_2f4 == 0x14;
  if ((uStack_2f4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_228._24_4_ = 0x14;
    _kjCondition_2.op.content.size_ = local_278.op.content.size_;
    _kjCondition_2.left = local_278.left;
    _kjCondition_2.right = local_278.right;
    _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar2;
    _kjCondition_3._24_4_ = uVar3;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_2dc = (uint)uStack_2f4;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd6,ERROR,
               "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)(local_228 + 0x18),
               &local_2dc);
  }
  this_00 = (PointerBuilder *)(local_228 + 0x18);
  local_228._24_8_ = root._builder.segment;
  pCStack_208 = root._builder.capTable;
  local_200 = root._builder.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&_kjCondition_4,this_00,(StructSize)0x140006,(word *)0x0);
  _kjCondition_2.left = _kjCondition_4.left;
  _kjCondition_2.right = _kjCondition_4._4_4_;
  _kjCondition_2.op.content.ptr = (char *)_kjCondition_4.right;
  _kjCondition_2.op.content.size_ = (size_t)_kjCondition_4.op.content.ptr;
  _kjCondition_2.result = _kjCondition_4.op.content.size_._0_1_;
  _kjCondition_2._25_3_ = _kjCondition_4.op.content.size_._1_3_;
  _kjCondition_2._28_4_ = _kjCondition_4.op.content.size_._4_4_;
  ListBuilder::asReader((ListReader *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2);
  uVar2 = _kjCondition_3._28_4_;
  uVar1 = _kjCondition_3._24_4_;
  local_278.op.content.size_ = _kjCondition_3.op.content.size_;
  local_278.left = _kjCondition_3.left;
  local_278.right = _kjCondition_3.right;
  local_278.op.content.ptr = _kjCondition_3.op.content.ptr;
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar9 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar9;
  if ((!bVar9) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd9,ERROR,
               "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
               (char (*) [37])"failed: expected (2) == (alr.size())",&_kjCondition_3,
               (int *)&_kjCondition_2,(uint *)&_kjCondition_4);
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_278.op.content.size_;
  _kjCondition_2.left = local_278.left;
  _kjCondition_2.right = local_278.right;
  _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar2;
  _kjCondition_3._24_4_ = uVar3;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar3 = _kjCondition_3._24_4_;
  uVar6 = local_2f8 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar6;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar6 == 0x30;
  if ((uVar6 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2dc = 0x30;
    _kjCondition_2.op.content.size_ = local_278.op.content.size_;
    _kjCondition_2.left = local_278.left;
    _kjCondition_2.right = local_278.right;
    _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar2;
    _kjCondition_3._24_4_ = uVar3;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_228._24_8_ = ZEXT48(local_2f8 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xda,ERROR,
               "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
               &_kjCondition_4,(int *)&local_2dc,(unsigned_long *)this_00);
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_278.op.content.size_;
  _kjCondition_2.left = local_278.left;
  _kjCondition_2.right = local_278.right;
  _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar2;
  _kjCondition_3._24_4_ = uVar3;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_a9f8;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_2f4 == 0x14;
  if ((uStack_2f4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_228._24_4_ = 0x14;
    _kjCondition_2.op.content.size_ = local_278.op.content.size_;
    _kjCondition_2.left = local_278.left;
    _kjCondition_2.right = local_278.right;
    _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar2;
    _kjCondition_3._24_4_ = uVar3;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_2dc = (uint)uStack_2f4;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)this_00,&local_2dc);
  }
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.right = (unsigned_long)root._builder.capTable;
  _kjCondition_4.op.content.ptr = (char *)root._builder.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&_kjCondition_2,(PointerBuilder *)&_kjCondition_4,(StructSize)0x140006,
             (word *)0x0);
  ListBuilder::asReader((ListReader *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2);
  uVar2 = _kjCondition_3._28_4_;
  uVar1 = _kjCondition_3._24_4_;
  local_278.op.content.size_ = _kjCondition_3.op.content.size_;
  local_278.left = _kjCondition_3.left;
  local_278.right = _kjCondition_3.right;
  local_278.op.content.ptr = _kjCondition_3.op.content.ptr;
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar9 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar9;
  if ((!bVar9) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
               (char (*) [37])"failed: expected (2) == (alr.size())",&_kjCondition_3,
               (int *)&_kjCondition_2,(uint *)&_kjCondition_4);
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_278.op.content.size_;
  _kjCondition_2.left = local_278.left;
  _kjCondition_2.right = local_278.right;
  _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar2;
  _kjCondition_3._24_4_ = uVar3;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar3 = _kjCondition_3._24_4_;
  uVar6 = local_2f8 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar6;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar6 == 0x30;
  if ((uVar6 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2dc = 0x30;
    _kjCondition_2.op.content.size_ = local_278.op.content.size_;
    _kjCondition_2.left = local_278.left;
    _kjCondition_2.right = local_278.right;
    _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar2;
    _kjCondition_3._24_4_ = uVar3;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_228._24_8_ = ZEXT48(local_2f8 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
               &_kjCondition_4,(int *)&local_2dc,(unsigned_long *)this_00);
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_278.op.content.size_;
  _kjCondition_2.left = local_278.left;
  _kjCondition_2.right = local_278.right;
  _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar2;
  _kjCondition_3._24_4_ = uVar3;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_a9f8;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_2f4 == 0x14;
  if ((uStack_2f4 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_228._24_4_ = 0x14;
    _kjCondition_2.op.content.size_ = local_278.op.content.size_;
    _kjCondition_2.left = local_278.left;
    _kjCondition_2.right = local_278.right;
    _kjCondition_2.op.content.ptr = local_278.op.content.ptr;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar2;
    _kjCondition_3._24_4_ = uVar3;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_2dc = (uint)uStack_2f4;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)this_00,&local_2dc);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Any, AnyList) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();
  List<TestAllTypes>::Builder b = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
  initTestMessage(b[0]);

  auto ptr = root.getAnyPointerField().getAs<AnyList>();

  EXPECT_EQ(2, ptr.size());
  EXPECT_EQ(48, ptr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, ptr.as<List<AnyStruct>>()[0].getPointerSection().size());

  auto readPtr = root.getAnyPointerField().asReader().getAs<AnyList>();

  EXPECT_EQ(2, readPtr.size());
  EXPECT_EQ(48, readPtr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, readPtr.as<List<AnyStruct>>()[0].getPointerSection().size());

  auto alb = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>());
  EXPECT_EQ(2, alb.size());
  EXPECT_EQ(48, alb.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alb.as<List<AnyStruct>>()[0].getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  alb = root.getAnyPointerField().getAs<List<TestAllTypes>>();
  EXPECT_EQ(2, alb.size());
  EXPECT_EQ(48, alb.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alb.as<List<AnyStruct>>()[0].getPointerSection().size());
#endif

  auto alr = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>().asReader());
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());

  alr = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>()).asReader();
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  alr = root.getAnyPointerField().getAs<List<TestAllTypes>>().asReader();
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());
#endif
}